

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Promise<void>_>::setCapacity(Vector<kj::Promise<void>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::Promise<void>_> newBuilder;
  ArrayBuilder<kj::Promise<void>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Promise<void>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::Promise<void>>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::Promise<void>>::addAll<kj::ArrayBuilder<kj::Promise<void>>>
            ((ArrayBuilder<kj::Promise<void>> *)&local_30,&this->builder);
  ArrayBuilder<kj::Promise<void>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::Promise<void>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }